

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O2

unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> __thiscall
webrtc::AudioConverter::Create
          (AudioConverter *this,size_t src_channels,size_t src_frames,size_t dst_channels,
          size_t dst_frames)

{
  DownmixConverter *this_00;
  AudioConverter *this_01;
  ResampleConverter *pRVar1;
  CompositionConverter *pCVar2;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  *this_02;
  _Head_base<0UL,_webrtc::AudioConverter_*,_false> local_90;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  converters;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_68;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_48;
  
  this->_vptr_AudioConverter = (_func_int **)0x0;
  if (dst_channels < src_channels) {
    if (src_frames != dst_frames) {
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = (AudioConverter *)operator_new(0x28);
      DownmixConverter::DownmixConverter
                ((DownmixConverter *)this_01,src_channels,src_frames,dst_channels,src_frames);
      local_90._M_head_impl = this_01;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&converters,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if (local_90._M_head_impl != (AudioConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,dst_channels,src_frames,dst_channels,dst_frames);
      local_90._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&converters,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar2 = (CompositionConverter *)operator_new(0x58);
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar2,&local_48);
      this->_vptr_AudioConverter = (_func_int **)pCVar2;
      this_02 = &local_48;
LAB_00149add:
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(this_02);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(&converters);
      return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
              )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
                )this;
    }
    this_00 = (DownmixConverter *)operator_new(0x28);
    DownmixConverter::DownmixConverter(this_00,src_channels,src_frames,dst_channels,src_frames);
  }
  else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,src_channels,src_frames,src_channels,dst_frames);
      local_90._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&converters,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pRVar1 = (ResampleConverter *)operator_new(0x28);
      UpmixConverter::UpmixConverter
                ((UpmixConverter *)pRVar1,src_channels,dst_frames,dst_channels,dst_frames);
      local_90._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&converters,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar2 = (CompositionConverter *)operator_new(0x58);
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           converters.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      converters.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar2,&local_68);
      this->_vptr_AudioConverter = (_func_int **)pCVar2;
      this_02 = &local_68;
      goto LAB_00149add;
    }
    this_00 = (DownmixConverter *)operator_new(0x28);
    UpmixConverter::UpmixConverter
              ((UpmixConverter *)this_00,src_channels,src_frames,dst_channels,src_frames);
  }
  else {
    if (src_frames != dst_frames) {
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,src_channels,src_frames,dst_channels,dst_frames);
      this->_vptr_AudioConverter = (_func_int **)pRVar1;
      return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
              )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
                )this;
    }
    this_00 = (DownmixConverter *)operator_new(0x28);
    CopyConverter::CopyConverter
              ((CopyConverter *)this_00,src_channels,src_frames,dst_channels,src_frames);
  }
  this->_vptr_AudioConverter = (_func_int **)this_00;
  return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
          )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AudioConverter> AudioConverter::Create(size_t src_channels,
                                                       size_t src_frames,
                                                       size_t dst_channels,
                                                       size_t dst_frames) {
  std::unique_ptr<AudioConverter> sp;
  if (src_channels > dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(std::unique_ptr<AudioConverter>(new DownmixConverter(
          src_channels, src_frames, dst_channels, src_frames)));
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              dst_channels, src_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new DownmixConverter(src_channels, src_frames, dst_channels,
                                    dst_frames));
    }
  } else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              src_channels, src_frames, src_channels, dst_frames)));
      converters.push_back(std::unique_ptr<AudioConverter>(new UpmixConverter(
          src_channels, dst_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new UpmixConverter(src_channels, src_frames, dst_channels,
                                  dst_frames));
    }
  } else if (src_frames != dst_frames) {
    sp.reset(new ResampleConverter(src_channels, src_frames, dst_channels,
                                   dst_frames));
  } else {
    sp.reset(new CopyConverter(src_channels, src_frames, dst_channels,
                               dst_frames));
  }

  return sp;
}